

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_schedule.c
# Opt level: O3

log_aspect_interface log_aspect_schedule_interface(void)

{
  return &log_aspect_schedule_interface::aspect_interface_schedule;
}

Assistant:

log_aspect_interface log_aspect_schedule_interface(void)
{
	static struct log_aspect_schedule_impl_type log_aspect_schedule_impl_obj = {
		&log_aspect_schedule_impl_execute
	};

	static struct log_aspect_interface_type aspect_interface_schedule = {
		&log_aspect_schedule_create,
		&log_aspect_schedule_impl_obj,
		&log_aspect_schedule_destroy
	};

	return &aspect_interface_schedule;
}